

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVectorEnumerator.cpp
# Opt level: O0

void __thiscall JsUtil::FBVEnumerator::MoveToNextBit(FBVEnumerator *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  BVIndex BVar4;
  undefined8 *in_FS_OFFSET;
  BVIndex i;
  FBVEnumerator *this_local;
  
  bVar2 = BVUnitT<unsigned_long>::IsEmpty(&this->curUnit);
  if (bVar2) {
    BVar3 = BVUnitT<unsigned_long>::Floor(this->curOffset);
    this->curOffset = BVar3;
    MoveToValidWord(this);
    bVar2 = End(this);
    if (bVar2) {
      return;
    }
  }
  BVar3 = BVUnitT<unsigned_long>::GetNextBit(&this->curUnit);
  if (BVar3 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVectorEnumerator.cpp"
                       ,0x34,"(BVInvalidIndex != i)",
                       "Fatal Exception. Error in Bitvector implementation");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  BVar4 = BVUnitT<unsigned_long>::Floor(this->curOffset);
  this->curOffset = BVar4 + BVar3;
  BVUnitT<unsigned_long>::Clear(&this->curUnit,BVar3);
  return;
}

Assistant:

void
    FBVEnumerator::MoveToNextBit()
    {
        if(curUnit.IsEmpty())
        {
            this->curOffset = BVUnit::Floor(curOffset);
            this->MoveToValidWord();
            if(this->End())
            {
                return;
            }
        }

        BVIndex i = curUnit.GetNextBit();
        AssertMsg(BVInvalidIndex != i, "Fatal Exception. Error in Bitvector implementation");

        curOffset = BVUnit::Floor(curOffset) + i ;
        curUnit.Clear(i);
    }